

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O2

void tokendif(tokcxdef *ctx,char *p,int len)

{
  if (ctx->tokcxifcnt != 0) {
    ctx->tokcxifcnt = ctx->tokcxifcnt + -1;
    tok_update_if_stat(ctx);
    return;
  }
  errlogf(ctx->tokcxerr,"TADS",0x72);
  return;
}

Assistant:

static void tokendif(tokcxdef *ctx, char *p, int len)
{
    /* if we're not expecting #endif, it's an error */
    if (ctx->tokcxifcnt == 0)
    {
        errlog(ctx->tokcxerr, ERR_BADENDIF);
        return;
    }

    /* remove the #if level */
    ctx->tokcxifcnt--;

    /* update the current status */
    tok_update_if_stat(ctx);
}